

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

void on_frame_received(void *context,AMQP_VALUE performative,uint32_t payload_size,
                      uchar *payload_bytes)

{
  uint uVar1;
  long lVar2;
  SESSION_STATE session_state;
  BEGIN_HANDLE __s2;
  _Bool _Var3;
  char cVar4;
  int iVar5;
  AMQP_VALUE pAVar6;
  LINK_ENDPOINT_INSTANCE *pLVar7;
  LINK_ENDPOINT_HANDLE link_endpoint;
  FLOW_HANDLE flow;
  char *pcVar8;
  char *pcVar9;
  CONNECTION_HANDLE pCVar10;
  ulong uVar11;
  uint32_t i;
  BEGIN_HANDLE begin_handle;
  role role;
  ATTACH_HANDLE attach_handle;
  AMQP_VALUE source;
  AMQP_VALUE target;
  uint32_t local_44;
  fields properties;
  uchar *local_38;
  
  pAVar6 = amqpvalue_get_inplace_descriptor(performative);
  _Var3 = is_begin_type_by_descriptor(pAVar6);
  if (_Var3) {
    iVar5 = amqpvalue_get_begin(performative,&begin_handle);
    if (iVar5 != 0) {
      pCVar10 = *(CONNECTION_HANDLE *)((long)context + 0x18);
      pcVar8 = "Cannot decode BEGIN frame";
LAB_0015719c:
      connection_close(pCVar10,"amqp:decode-error",pcVar8,(AMQP_VALUE)0x0);
      return;
    }
    iVar5 = begin_get_incoming_window(begin_handle,(uint32_t *)((long)context + 0x60));
    if ((iVar5 != 0) ||
       (iVar5 = begin_get_next_outgoing_id(begin_handle,(transfer_number *)((long)context + 0x4c)),
       iVar5 != 0)) {
      begin_destroy(begin_handle);
      session_set_state((SESSION_INSTANCE *)context,SESSION_STATE_DISCARDING);
      pCVar10 = *(CONNECTION_HANDLE *)((long)context + 0x18);
      pcVar8 = "Cannot get incoming windows and next outgoing id";
      goto LAB_0015719c;
    }
    begin_destroy(begin_handle);
    if (*(int *)((long)context + 0x10) == 1) {
      session_set_state((SESSION_INSTANCE *)context,SESSION_STATE_BEGIN_RCVD);
      iVar5 = send_begin((SESSION_INSTANCE *)context);
      if (iVar5 != 0) {
        pCVar10 = *(CONNECTION_HANDLE *)((long)context + 0x18);
        pcVar8 = "Failed sending BEGIN frame";
LAB_001574d8:
        connection_close(pCVar10,"amqp:internal-error",pcVar8,(AMQP_VALUE)0x0);
        goto LAB_001574df;
      }
    }
    else if (*(int *)((long)context + 0x10) != 2) {
      return;
    }
    session_state = SESSION_STATE_MAPPED;
  }
  else {
    _Var3 = is_attach_type_by_descriptor(pAVar6);
    if (_Var3) {
      begin_handle = (BEGIN_HANDLE)0x0;
      iVar5 = amqpvalue_get_attach(performative,&attach_handle);
      if (iVar5 != 0) {
        pcVar9 = "amqp:decode-error";
        pcVar8 = "Cannot decode ATTACH frame";
        goto LAB_001574fe;
      }
      iVar5 = attach_get_name((ATTACH_HANDLE)CONCAT44(attach_handle._4_4_,(handle)attach_handle),
                              (char **)&begin_handle);
      if (iVar5 == 0) {
        iVar5 = attach_get_role((ATTACH_HANDLE)CONCAT44(attach_handle._4_4_,(handle)attach_handle),
                                &role);
        if (iVar5 == 0) {
          iVar5 = attach_get_source((ATTACH_HANDLE)
                                    CONCAT44(attach_handle._4_4_,(handle)attach_handle),&source);
          if (iVar5 != 0) {
            source = (AMQP_VALUE)0x0;
          }
          iVar5 = attach_get_target((ATTACH_HANDLE)
                                    CONCAT44(attach_handle._4_4_,(handle)attach_handle),&target);
          if (iVar5 != 0) {
            target = (AMQP_VALUE)0x0;
          }
          local_44 = payload_size;
          local_38 = payload_bytes;
          iVar5 = attach_get_properties
                            ((ATTACH_HANDLE)CONCAT44(attach_handle._4_4_,(handle)attach_handle),
                             &properties);
          __s2 = begin_handle;
          if (iVar5 != 0) {
            properties = (fields)0x0;
          }
          uVar1 = *(uint *)((long)context + 0x30);
          for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
            lVar2 = *(long *)((long)context + 0x28);
            iVar5 = strcmp((char *)**(undefined8 **)(lVar2 + uVar11 * 8),(char *)__s2);
            if (iVar5 == 0) {
              if ((uVar1 != (uint)uVar11) && (lVar2 = *(long *)(lVar2 + uVar11 * 8), lVar2 != 0)) {
                if (*(int *)(lVar2 + 0x38) == 2) goto LAB_001572f4;
                iVar5 = attach_get_handle((ATTACH_HANDLE)
                                          CONCAT44(attach_handle._4_4_,(handle)attach_handle),
                                          (handle *)(lVar2 + 8));
                if (iVar5 != 0) goto LAB_001575e7;
                *(undefined4 *)(lVar2 + 0x38) = 1;
                if ((*(code **)((long)context + 0x38) != (code *)0x0) &&
                   (cVar4 = (**(code **)((long)context + 0x38))
                                      (*(undefined8 *)((long)context + 0x40),lVar2,begin_handle,role
                                       ,source,target,properties), cVar4 == '\0')) {
                  *(undefined4 *)(lVar2 + 0x38) = 2;
                }
                (**(code **)(lVar2 + 0x10))
                          (*(undefined8 *)(lVar2 + 0x28),performative,local_44,local_38);
                goto LAB_001572f4;
              }
              break;
            }
          }
          if (*(long *)((long)context + 0x38) == 0) goto LAB_001572f4;
          link_endpoint = session_create_link_endpoint((SESSION_HANDLE)context,(char *)__s2);
          if (link_endpoint == (LINK_ENDPOINT_HANDLE)0x0) {
            pcVar9 = "amqp:internal-error";
            pcVar8 = "Cannot create link endpoint";
          }
          else {
            iVar5 = attach_get_handle((ATTACH_HANDLE)
                                      CONCAT44(attach_handle._4_4_,(handle)attach_handle),
                                      &link_endpoint->input_handle);
            if (iVar5 == 0) {
              link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_ATTACHED;
              cVar4 = (**(code **)((long)context + 0x38))
                                (*(undefined8 *)((long)context + 0x40),link_endpoint,begin_handle,
                                 role,source,target,properties);
              if (cVar4 == '\0') {
                remove_link_endpoint(link_endpoint);
                free_link_endpoint(link_endpoint);
              }
              else if (link_endpoint->frame_received_callback != (ON_ENDPOINT_FRAME_RECEIVED)0x0) {
                (*link_endpoint->frame_received_callback)
                          (link_endpoint->callback_context,performative,local_44,local_38);
              }
              goto LAB_001572f4;
            }
LAB_001575e7:
            pcVar9 = "amqp:decode-error";
            pcVar8 = "Cannot get input handle from ATTACH frame";
          }
        }
        else {
          pcVar9 = "amqp:decode-error";
          pcVar8 = "Cannot get link role from ATTACH frame";
        }
      }
      else {
        pcVar9 = "amqp:decode-error";
        pcVar8 = "Cannot get link name from ATTACH frame";
      }
      end_session_with_error((SESSION_INSTANCE *)context,pcVar9,pcVar8);
LAB_001572f4:
      attach_destroy((ATTACH_HANDLE)CONCAT44(attach_handle._4_4_,(handle)attach_handle));
      return;
    }
    _Var3 = is_detach_type_by_descriptor(pAVar6);
    if (_Var3) {
      iVar5 = amqpvalue_get_detach(performative,(DETACH_HANDLE *)&begin_handle);
      if (iVar5 == 0) {
        iVar5 = detach_get_handle((DETACH_HANDLE)begin_handle,(handle *)&attach_handle);
        if (iVar5 != 0) {
          end_session_with_error
                    ((SESSION_INSTANCE *)context,"amqp:decode-error",
                     "Cannot get handle from DETACH frame");
          detach_destroy((DETACH_HANDLE)begin_handle);
          return;
        }
        detach_destroy((DETACH_HANDLE)begin_handle);
        pLVar7 = find_link_endpoint_by_input_handle
                           ((SESSION_INSTANCE *)context,(handle)attach_handle);
        if (pLVar7 != (LINK_ENDPOINT_INSTANCE *)0x0) {
          if (pLVar7->link_endpoint_state == LINK_ENDPOINT_STATE_DETACHING) {
            remove_link_endpoint(pLVar7);
            free_link_endpoint(pLVar7);
            return;
          }
          pLVar7->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
          (*pLVar7->frame_received_callback)
                    (pLVar7->callback_context,performative,payload_size,payload_bytes);
          return;
        }
        pcVar9 = "amqp:session:unattached-handle";
        pcVar8 = "";
      }
      else {
        pcVar9 = "amqp:decode-error";
        pcVar8 = "Cannot decode DETACH frame";
      }
LAB_001574fe:
      end_session_with_error((SESSION_INSTANCE *)context,pcVar9,pcVar8);
      return;
    }
    _Var3 = is_flow_type_by_descriptor(pAVar6);
    if (_Var3) {
      iVar5 = amqpvalue_get_flow(performative,(FLOW_HANDLE *)&begin_handle);
      if (iVar5 == 0) {
        iVar5 = flow_get_next_incoming_id((FLOW_HANDLE)begin_handle,(transfer_number *)&source);
        if (iVar5 != 0) {
          source = (AMQP_VALUE)CONCAT44(source._4_4_,*(undefined4 *)((long)context + 0x48));
        }
        iVar5 = flow_get_next_outgoing_id
                          ((FLOW_HANDLE)begin_handle,(transfer_number *)((long)context + 0x4c));
        if ((iVar5 == 0) &&
           (iVar5 = flow_get_incoming_window((FLOW_HANDLE)begin_handle,(uint32_t *)&target),
           iVar5 == 0)) {
          *(int *)((long)context + 0x60) =
               ((int)target + (int)source) - *(int *)((long)context + 0x48);
          iVar5 = flow_get_handle((FLOW_HANDLE)begin_handle,(handle *)&attach_handle);
          if (iVar5 == 0) {
            pLVar7 = find_link_endpoint_by_input_handle
                               ((SESSION_INSTANCE *)context,(handle)attach_handle);
          }
          else {
            pLVar7 = (LINK_ENDPOINT_INSTANCE *)0x0;
          }
          flow_destroy((FLOW_HANDLE)begin_handle);
          if ((pLVar7 != (LINK_ENDPOINT_INSTANCE *)0x0) &&
             (pLVar7->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)) {
            (*pLVar7->frame_received_callback)
                      (pLVar7->callback_context,performative,payload_size,payload_bytes);
          }
          uVar11 = 0;
          while( true ) {
            if (*(int *)((long)context + 0x60) == 0) {
              return;
            }
            if (*(uint *)((long)context + 0x30) <= uVar11) break;
            lVar2 = *(long *)(*(long *)((long)context + 0x28) + uVar11 * 8);
            if ((*(int *)(lVar2 + 0x38) != 2) && (*(code **)(lVar2 + 0x20) != (code *)0x0)) {
              (**(code **)(lVar2 + 0x20))(*(undefined8 *)(lVar2 + 0x28));
            }
            uVar11 = uVar11 + 1;
          }
          return;
        }
        flow_destroy((FLOW_HANDLE)begin_handle);
      }
      pcVar9 = "amqp:decode-error";
      pcVar8 = "Cannot decode FLOW frame";
      goto LAB_001574fe;
    }
    _Var3 = is_transfer_type_by_descriptor(pAVar6);
    if (_Var3) {
      iVar5 = amqpvalue_get_transfer(performative,(TRANSFER_HANDLE *)&begin_handle);
      if (iVar5 == 0) {
        transfer_get_delivery_id((TRANSFER_HANDLE)begin_handle,(delivery_number *)&source);
        iVar5 = transfer_get_handle((TRANSFER_HANDLE)begin_handle,(handle *)&attach_handle);
        transfer_destroy((TRANSFER_HANDLE)begin_handle);
        if (iVar5 == 0) {
          *(int *)((long)context + 0x4c) = *(int *)((long)context + 0x4c) + 1;
          *(int *)((long)context + 100) = *(int *)((long)context + 100) + -1;
          *(int *)((long)context + 0x54) = *(int *)((long)context + 0x54) + -1;
          pLVar7 = find_link_endpoint_by_input_handle
                             ((SESSION_INSTANCE *)context,(handle)attach_handle);
          if (pLVar7 == (LINK_ENDPOINT_INSTANCE *)0x0) {
            end_session_with_error((SESSION_INSTANCE *)context,"amqp:session:unattached-handle","");
          }
          else if (pLVar7->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING) {
            (*pLVar7->frame_received_callback)
                      (pLVar7->callback_context,performative,payload_size,payload_bytes);
          }
          if (*(int *)((long)context + 0x54) != 0) {
            return;
          }
          *(uint32_t *)((long)context + 0x54) = *(uint32_t *)((long)context + 0x50);
          flow = flow_create(*(uint32_t *)((long)context + 0x50),
                             *(transfer_number *)((long)context + 0x48),
                             *(uint32_t *)((long)context + 0x58));
          if (flow == (FLOW_HANDLE)0x0) {
            return;
          }
          iVar5 = flow_set_next_incoming_id(flow,*(transfer_number *)((long)context + 0x4c));
          if ((iVar5 == 0) && (pAVar6 = amqpvalue_create_flow(flow), pAVar6 != (AMQP_VALUE)0x0)) {
            connection_encode_frame
                      (*(ENDPOINT_HANDLE *)((long)context + 0x20),pAVar6,(PAYLOAD *)0x0,0,
                       (ON_SEND_COMPLETE)0x0,(void *)0x0);
            amqpvalue_destroy(pAVar6);
          }
          flow_destroy(flow);
          return;
        }
        pcVar9 = "amqp:decode-error";
        pcVar8 = "Cannot get handle from TRANSFER frame";
      }
      else {
        pcVar9 = "amqp:decode-error";
        pcVar8 = "Cannot decode TRANSFER frame";
      }
      goto LAB_001574fe;
    }
    _Var3 = is_disposition_type_by_descriptor(pAVar6);
    if (_Var3) {
      for (uVar11 = 0; uVar11 < *(uint *)((long)context + 0x30); uVar11 = uVar11 + 1) {
        lVar2 = *(long *)(*(long *)((long)context + 0x28) + uVar11 * 8);
        if (*(int *)(lVar2 + 0x38) != 2) {
          (**(code **)(lVar2 + 0x10))
                    (*(undefined8 *)(lVar2 + 0x28),performative,payload_size,payload_bytes);
        }
      }
      return;
    }
    _Var3 = is_end_type_by_descriptor(pAVar6);
    if (!_Var3) {
      return;
    }
    iVar5 = amqpvalue_get_end(performative,(END_HANDLE *)&begin_handle);
    if (iVar5 != 0) {
      pcVar9 = "amqp:decode-error";
      pcVar8 = "Cannot decode END frame";
      goto LAB_001574fe;
    }
    end_destroy((END_HANDLE)begin_handle);
    if ((*(uint *)((long)context + 0x10) & 0xfffffffe) == 6) {
      return;
    }
    session_set_state((SESSION_INSTANCE *)context,SESSION_STATE_END_RCVD);
    iVar5 = send_end_frame((SESSION_INSTANCE *)context,(ERROR_HANDLE)0x0);
    if (iVar5 != 0) {
      pCVar10 = *(CONNECTION_HANDLE *)((long)context + 0x18);
      pcVar8 = "Cannot send END frame.";
      goto LAB_001574d8;
    }
LAB_001574df:
    session_state = SESSION_STATE_DISCARDING;
  }
  session_set_state((SESSION_INSTANCE *)context,session_state);
  return;
}

Assistant:

static void on_frame_received(void* context, AMQP_VALUE performative, uint32_t payload_size, const unsigned char* payload_bytes)
{
    SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)context;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);

    if (is_begin_type_by_descriptor(descriptor))
    {
        BEGIN_HANDLE begin_handle;

        if (amqpvalue_get_begin(performative, &begin_handle) != 0)
        {
            connection_close(session_instance->connection, "amqp:decode-error", "Cannot decode BEGIN frame", NULL);
        }
        else
        {
            if ((begin_get_incoming_window(begin_handle, &session_instance->remote_incoming_window) != 0) ||
                (begin_get_next_outgoing_id(begin_handle, &session_instance->next_incoming_id) != 0))
            {
                /* error */
                begin_destroy(begin_handle);
                session_set_state(session_instance, SESSION_STATE_DISCARDING);
                connection_close(session_instance->connection, "amqp:decode-error", "Cannot get incoming windows and next outgoing id", NULL);
            }
            else
            {
                begin_destroy(begin_handle);

                if (session_instance->session_state == SESSION_STATE_BEGIN_SENT)
                {
                    session_set_state(session_instance, SESSION_STATE_MAPPED);
                }
                else if(session_instance->session_state == SESSION_STATE_UNMAPPED)
                {
                    session_set_state(session_instance, SESSION_STATE_BEGIN_RCVD);
                    if (send_begin(session_instance) != 0)
                    {
                        connection_close(session_instance->connection, "amqp:internal-error", "Failed sending BEGIN frame", NULL);
                        session_set_state(session_instance, SESSION_STATE_DISCARDING);
                    }
                    else
                    {
                        session_set_state(session_instance, SESSION_STATE_MAPPED);
                    }
                }
            }
        }
    }
    else if (is_attach_type_by_descriptor(descriptor))
    {
        const char* name = NULL;
        ATTACH_HANDLE attach_handle;

        if (amqpvalue_get_attach(performative, &attach_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode ATTACH frame");
        }
        else
        {
            role role;
            AMQP_VALUE source;
            AMQP_VALUE target;
            fields properties;

            if (attach_get_name(attach_handle, &name) != 0)
            {
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get link name from ATTACH frame");
            }
            else if (attach_get_role(attach_handle, &role) != 0)
            {
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get link role from ATTACH frame");
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint;

                if (attach_get_source(attach_handle, &source) != 0)
                {
                    source = NULL;
                }
                if (attach_get_target(attach_handle, &target) != 0)
                {
                    target = NULL;
                }
                if (attach_get_properties(attach_handle, &properties) != 0)
                {
                    properties = NULL;
                }

                link_endpoint = find_link_endpoint_by_name(session_instance, name);
                if (link_endpoint == NULL)
                {
                    /* new link attach */
                    if (session_instance->on_link_attached != NULL)
                    {
                        LINK_ENDPOINT_HANDLE new_link_endpoint = session_create_link_endpoint(session_instance, name);
                        if (new_link_endpoint == NULL)
                        {
                            end_session_with_error(session_instance, "amqp:internal-error", "Cannot create link endpoint");
                        }
                        else if (attach_get_handle(attach_handle, &new_link_endpoint->input_handle) != 0)
                        {
                            end_session_with_error(session_instance, "amqp:decode-error", "Cannot get input handle from ATTACH frame");
                        }
                        else
                        {
                            new_link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_ATTACHED;

                            if (!session_instance->on_link_attached(session_instance->on_link_attached_callback_context, new_link_endpoint, name, role, source, target, properties))
                            {
                                remove_link_endpoint(new_link_endpoint);
                                free_link_endpoint(new_link_endpoint);
                                new_link_endpoint = NULL;
                            }
                            else
                            {
                                if (new_link_endpoint->frame_received_callback != NULL)
                                {
                                    new_link_endpoint->frame_received_callback(new_link_endpoint->callback_context, performative, payload_size, payload_bytes);
                                }
                            }
                        }
                    }
                }
                else if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                {
                    if (attach_get_handle(attach_handle, &link_endpoint->input_handle) != 0)
                    {
                        end_session_with_error(session_instance, "amqp:decode-error", "Cannot get input handle from ATTACH frame");
                    }
                    else
                    {
                        link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_ATTACHED;

                        if (session_instance->on_link_attached != NULL)
                        {
                            if (!session_instance->on_link_attached(session_instance->on_link_attached_callback_context, link_endpoint, name, role, source, target, properties))
                            {
                                link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
                            }
                        }

                        link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
                    }
                }
            }

            attach_destroy(attach_handle);
        }
    }
    else if (is_detach_type_by_descriptor(descriptor))
    {
        DETACH_HANDLE detach_handle;

        if (amqpvalue_get_detach(performative, &detach_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode DETACH frame");
        }
        else
        {
            uint32_t remote_handle;
            if (detach_get_handle(detach_handle, &remote_handle) != 0)
            {
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get handle from DETACH frame");

                detach_destroy(detach_handle);
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint;
                detach_destroy(detach_handle);

                link_endpoint = find_link_endpoint_by_input_handle(session_instance, remote_handle);
                if (link_endpoint == NULL)
                {
                    end_session_with_error(session_instance, "amqp:session:unattached-handle", "");
                }
                else
                {
                    if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                    {
                        link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
                        link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
                    }
                    else
                    {
                        /* remove the link endpoint */
                        remove_link_endpoint(link_endpoint);
                        free_link_endpoint(link_endpoint);
                    }
                }
            }
        }
    }
    else if (is_flow_type_by_descriptor(descriptor))
    {
        FLOW_HANDLE flow_handle;

        if (amqpvalue_get_flow(performative, &flow_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode FLOW frame");
        }
        else
        {
            uint32_t remote_handle;
            transfer_number flow_next_incoming_id;
            uint32_t flow_incoming_window;

            if (flow_get_next_incoming_id(flow_handle, &flow_next_incoming_id) != 0)
            {
                /*
                If the next-incoming-id field of the flow frame is not set,
                then remote-incomingwindow is computed as follows:
                initial-outgoing-id(endpoint) + incoming-window(flow) - next-outgoing-id(endpoint)
                */
                flow_next_incoming_id = session_instance->next_outgoing_id;
            }

            if ((flow_get_next_outgoing_id(flow_handle, &session_instance->next_incoming_id) != 0) ||
                (flow_get_incoming_window(flow_handle, &flow_incoming_window) != 0))
            {
                flow_destroy(flow_handle);

                end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode FLOW frame");
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint_instance = NULL;
                size_t i;

                session_instance->remote_incoming_window = flow_next_incoming_id + flow_incoming_window - session_instance->next_outgoing_id;

                if (flow_get_handle(flow_handle, &remote_handle) == 0)
                {
                    link_endpoint_instance = find_link_endpoint_by_input_handle(session_instance, remote_handle);
                }

                flow_destroy(flow_handle);

                if (link_endpoint_instance != NULL)
                {
                    if (link_endpoint_instance->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                    {
                        link_endpoint_instance->frame_received_callback(link_endpoint_instance->callback_context, performative, payload_size, payload_bytes);
                    }
                }

                i = 0;
                while ((session_instance->remote_incoming_window > 0) && (i < session_instance->link_endpoint_count))
                {
                    /* notify the caller that it can send here */
                    if (session_instance->link_endpoints[i]->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING &&
                        session_instance->link_endpoints[i]->on_session_flow_on != NULL)
                    {
                        session_instance->link_endpoints[i]->on_session_flow_on(session_instance->link_endpoints[i]->callback_context);
                    }

                    i++;
                }
            }
        }
    }
    else if (is_transfer_type_by_descriptor(descriptor))
    {
        TRANSFER_HANDLE transfer_handle;

        if (amqpvalue_get_transfer(performative, &transfer_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode TRANSFER frame");
        }
        else
        {
            uint32_t remote_handle;
            delivery_number delivery_id;

            transfer_get_delivery_id(transfer_handle, &delivery_id);
            if (transfer_get_handle(transfer_handle, &remote_handle) != 0)
            {
                transfer_destroy(transfer_handle);
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get handle from TRANSFER frame");
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint;
                transfer_destroy(transfer_handle);

                session_instance->next_incoming_id++;
                session_instance->remote_outgoing_window--;
                session_instance->incoming_window--;

                link_endpoint = find_link_endpoint_by_input_handle(session_instance, remote_handle);
                if (link_endpoint == NULL)
                {
                    end_session_with_error(session_instance, "amqp:session:unattached-handle", "");
                }
                else
                {
                    if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                    {
                        link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
                    }
                }

                if (session_instance->incoming_window == 0)
                {
                    session_instance->incoming_window = session_instance->desired_incoming_window;
                    send_flow(session_instance);
                }
            }
        }
    }
    else if (is_disposition_type_by_descriptor(descriptor))
    {
        uint32_t i;

        for (i = 0; i < session_instance->link_endpoint_count; i++)
        {
            LINK_ENDPOINT_INSTANCE* link_endpoint = session_instance->link_endpoints[i];
            if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
            {
                link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
            }
        }
    }
    else if (is_end_type_by_descriptor(descriptor))
    {
        END_HANDLE end_handle;

        if (amqpvalue_get_end(performative, &end_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode END frame");
        }
        else
        {
            end_destroy(end_handle);
            if ((session_instance->session_state != SESSION_STATE_END_RCVD) &&
                (session_instance->session_state != SESSION_STATE_DISCARDING))
            {
                session_set_state(session_instance, SESSION_STATE_END_RCVD);
                if (send_end_frame(session_instance, NULL) != 0)
                {
                    /* fatal error */
                    (void)connection_close(session_instance->connection, "amqp:internal-error", "Cannot send END frame.", NULL);
                }

                session_set_state(session_instance, SESSION_STATE_DISCARDING);
            }
        }
    }
}